

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::TransactionContext::GetTxInIndex(TransactionContext *this,OutPoint *outpoint)

{
  undefined4 uVar1;
  uint32_t uVar2;
  long *in_RDI;
  undefined1 local_30 [48];
  
  cfd::core::OutPoint::GetTxid();
  uVar1 = cfd::core::OutPoint::GetVout();
  uVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_30,uVar1);
  core::Txid::~Txid((Txid *)0x3acfbe);
  return uVar2;
}

Assistant:

uint32_t TransactionContext::GetTxInIndex(const OutPoint& outpoint) const {
  return GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}